

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

void * cram_flush_thread(void *arg)

{
  int iVar1;
  cram_job *j;
  void *arg_local;
  
  iVar1 = cram_encode_container(*arg,*(cram_container **)((long)arg + 8));
  arg_local = arg;
  if (iVar1 != 0) {
    fprintf(_stderr,"cram_encode_container failed\n");
    arg_local = (void *)0x0;
  }
  return arg_local;
}

Assistant:

void *cram_flush_thread(void *arg) {
    cram_job *j = (cram_job *)arg;

    /* Encode the container blocks and generate compression header */
    if (0 != cram_encode_container(j->fd, j->c)) {
	fprintf(stderr, "cram_encode_container failed\n");
	return NULL;
    }

    return arg;
}